

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydro_ebgodunov.cpp
# Opt level: O0

void EBGodunov::ComputeAofs
               (MultiFab *aofs,int aofs_comp,int ncomp,MultiFab *state,int state_comp,MultiFab *umac
               ,MultiFab *vmac,MultiFab *wmac,MultiFab *xedge,MultiFab *yedge,MultiFab *zedge,
               int edge_comp,bool known_edgestate,MultiFab *xfluxes,MultiFab *yfluxes,
               MultiFab *zfluxes,int fluxes_comp,MultiFab *fq,int fq_comp,MultiFab *divu,
               Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *h_bc,BCRec *d_bc,Geometry *geom,
               Vector<int,_std::allocator<int>_> *iconserv,Real dt,bool is_velocity,
               string *redistribution_type)

{
  Arena *pAVar1;
  uint uVar2;
  bool bVar3;
  FabType FVar4;
  iterator piVar5;
  FabFactory<amrex::FArrayBox> *pFVar6;
  Long LVar7;
  int *piVar8;
  reference ppMVar9;
  EBCellFlagFab *pEVar10;
  FabArrayBase *in_RCX;
  long lVar11;
  uint in_EDX;
  undefined8 *puVar12;
  Array4<const_double> *in_RDI;
  undefined8 *puVar13;
  Array4<double> *in_R9;
  byte bVar14;
  Array4<double> *in_stack_00000008;
  Array4<double> *in_stack_00000010;
  byte in_stack_00000038;
  anon_class_584_10_5c229435 *in_stack_00000080;
  MultiCutFab *in_stack_00000088;
  byte in_stack_00000098;
  string *in_stack_000000a0;
  Array4<double> scratch;
  Elixir eli_1;
  FArrayBox tmpfab_1;
  Box gbx;
  Array4<const_double> *vfrac_arr_1;
  Array4<const_double> ccc;
  Array4<const_double> fcz_1;
  Array4<const_double> fcy_1;
  Array4<const_double> fcx_1;
  Array4<const_double> apz_1;
  Array4<const_double> apy_1;
  Array4<const_double> apx_1;
  Box result_2;
  Array4<double> *advc_arr_1;
  undefined1 in_stack_00000b87;
  Real in_stack_00000b88;
  Array4<double> *in_stack_00000b90;
  Array4<double> *aofs_arr_1;
  Array4<double> *in_stack_00000ba0;
  Array4<const_double> *in_stack_00000ba8;
  int in_stack_00000bb4;
  Box *in_stack_00000bb8;
  Array4<const_amrex::EBCellFlag> *flag;
  EBCellFlagFab *flagfab_1;
  Box *bx_1;
  MFIter mfi_1;
  Array4<double> *divu_arr_1;
  Elixir eli;
  Box result_1;
  FArrayBox tmpfab;
  int ngrow;
  Array4<const_amrex::EBCellFlag> *flags_arr;
  Array4<const_double> *vfrac_arr;
  Array4<const_double> *ccent_arr;
  Array4<const_double> *apz;
  Array4<const_double> *apy;
  Array4<const_double> *apx;
  Array4<const_double> *fcz;
  Array4<const_double> *fcy;
  Array4<const_double> *fcx;
  Array4<double> *divu_arr;
  Array4<double> *aofs_arr;
  Box *zbx;
  Box *ybx;
  Box *xbx;
  Array4<double> advc_arr;
  Array4<const_double> *w;
  Array4<const_double> *v;
  Array4<const_double> *u_1;
  Array4<double> *zed;
  Array4<double> *yed;
  Array4<double> *xed;
  Array4<double> *fz;
  Array4<double> *fy;
  Array4<double> *fx;
  Box result;
  bool regular;
  EBCellFlagFab *flagfab;
  Box *bx;
  MFIter mfi;
  Real mult;
  Array<const_MultiFab_*,_3> u;
  Long i;
  MultiFab divu_mac;
  MultiFab advc;
  Array<const_MultiCutFab_*,_3> *areafrac;
  MultiFab *vfrac;
  MultiCutFab *ccent;
  Array<const_MultiCutFab_*,_3> *fcent;
  FabArray<amrex::EBCellFlagFab> *flags;
  EBFArrayBoxFactory *ebfact;
  int *iconserv_ptr;
  DeviceVector<int> iconserv_d;
  bool fluxes_are_area_weighted;
  Array4<const_double> *in_stack_000023f0;
  Array4<const_double> *in_stack_000023f8;
  Array4<const_double> *in_stack_00002400;
  Array4<const_double> *in_stack_00002408;
  Array4<const_double> *in_stack_00002410;
  Geometry *in_stack_00002418;
  Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *in_stack_00002420;
  BCRec *in_stack_00002428;
  int *in_stack_00002430;
  Real *in_stack_00002438;
  Array4<const_amrex::EBCellFlag> *in_stack_00002440;
  Array4<const_double> *in_stack_00002448;
  Array4<const_double> *in_stack_00002450;
  Array4<const_double> *in_stack_00002458;
  Array4<const_double> *in_stack_00002460;
  Array4<const_double> *in_stack_00002468;
  Array4<const_double> *in_stack_00002470;
  Array4<const_double> *in_stack_00002478;
  Array4<const_double> *in_stack_00002480;
  Array4<const_double> *in_stack_00002490;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffd998;
  undefined1 *puVar15;
  MultiCutFab *pMVar16;
  MultiCutFab *in_stack_ffffffffffffd9a0;
  Array4<const_double> *pAVar17;
  FabArray<amrex::EBCellFlagFab> *in_stack_ffffffffffffd9a8;
  FabArray<amrex::FArrayBox> *in_stack_ffffffffffffd9b0;
  MultiCutFab *in_stack_ffffffffffffd9b8;
  FabArray<amrex::FArrayBox> *in_stack_ffffffffffffd9c0;
  undefined4 uVar18;
  undefined1 do_tiling_;
  FabArrayBase *in_stack_ffffffffffffd9c8;
  undefined4 uVar19;
  MultiCutFab *in_stack_ffffffffffffd9d0;
  BoxArray *in_stack_ffffffffffffd9d8;
  anon_class_584_10_5c229435 *in_stack_ffffffffffffd9e0;
  MultiCutFab *in_stack_ffffffffffffd9e8;
  anon_class_584_10_5c229435 *paVar20;
  MultiCutFab *in_stack_ffffffffffffd9f0;
  FabArrayBase *in_stack_ffffffffffffda00;
  double *in_stack_ffffffffffffda08;
  MFIter *in_stack_ffffffffffffda10;
  undefined4 in_stack_ffffffffffffdac0;
  uint in_stack_ffffffffffffdac4;
  EBCellFlagFab *in_stack_ffffffffffffdac8;
  undefined8 in_stack_ffffffffffffdaf8;
  Real in_stack_ffffffffffffdb00;
  undefined8 in_stack_ffffffffffffdb08;
  Array4<const_double> *in_stack_ffffffffffffdb10;
  Array4<const_double> *in_stack_ffffffffffffdb18;
  Array4<const_double> *in_stack_ffffffffffffdb20;
  Array4<double> *in_stack_ffffffffffffdb28;
  Box *in_stack_ffffffffffffdb30;
  undefined8 in_stack_ffffffffffffdb38;
  Array4<double> *this;
  undefined6 in_stack_ffffffffffffdb40;
  undefined1 in_stack_ffffffffffffdb46;
  undefined1 in_stack_ffffffffffffdb47;
  Array4<const_double> *in_stack_ffffffffffffdb48;
  Array4<const_double> *in_stack_ffffffffffffdb50;
  Array4<const_double> *in_stack_ffffffffffffdb58;
  Array4<const_double> *in_stack_ffffffffffffdb60;
  Array4<double> *in_stack_ffffffffffffdb68;
  Box *in_stack_ffffffffffffdb70;
  undefined7 in_stack_ffffffffffffdba0;
  undefined1 in_stack_ffffffffffffdba7;
  undefined8 in_stack_ffffffffffffdbb0;
  Geometry *in_stack_ffffffffffffdbb8;
  undefined8 in_stack_ffffffffffffdbc0;
  int iVar21;
  char *in_stack_ffffffffffffdbc8;
  undefined4 in_stack_ffffffffffffdbd0;
  undefined4 in_stack_ffffffffffffdbd4;
  Geometry *in_stack_ffffffffffffdbe0;
  Array<const_MultiFab_*,_3> *in_stack_ffffffffffffdbe8;
  MultiFab *in_stack_ffffffffffffdbf0;
  Array4<double> *in_stack_ffffffffffffdd08;
  Array4<const_double> *in_stack_ffffffffffffdd10;
  MFIter *in_stack_ffffffffffffdd18;
  BARef *in_stack_ffffffffffffdd20;
  Array4<double> *in_stack_ffffffffffffdd28;
  Array4<double> *in_stack_ffffffffffffdd30;
  MultiCutFab *in_stack_ffffffffffffdd38;
  uint in_stack_ffffffffffffde8c;
  Array4<const_double> *umac_00;
  Array4<double> *in_stack_ffffffffffffdea0;
  Array4<double> *in_stack_ffffffffffffdea8;
  Array4<double> *in_stack_ffffffffffffdeb0;
  Box *bx_00;
  undefined1 local_20d8 [24];
  Array4<const_double> *in_stack_ffffffffffffdf40;
  Array4<const_double> *in_stack_ffffffffffffdf48;
  Array4<const_double> *in_stack_ffffffffffffdf50;
  Array4<const_double> *in_stack_ffffffffffffdf58;
  Geometry *in_stack_ffffffffffffdf60;
  int in_stack_ffffffffffffdf68;
  undefined1 local_2058 [128];
  string local_1fd8 [152];
  Array4<const_double> *in_stack_ffffffffffffe0c0;
  Array4<const_double> *in_stack_ffffffffffffe0c8;
  Array4<const_double> *in_stack_ffffffffffffe0d0;
  Array4<const_double> *in_stack_ffffffffffffe0d8;
  Array4<const_double> *in_stack_ffffffffffffe0e0;
  Array4<const_double> *in_stack_ffffffffffffe0e8;
  Array4<const_double> *in_stack_ffffffffffffe0f0;
  RefID in_stack_ffffffffffffe0f8;
  int in_stack_ffffffffffffe100;
  Array4<const_amrex::EBCellFlag> *in_stack_ffffffffffffe108;
  Array4<double> local_1ed8;
  undefined1 local_1e80 [72];
  _func_int **local_1e38;
  int iStack_1e30;
  int local_1e2c;
  int iStack_1e28;
  undefined8 uStack_1e24;
  undefined1 local_1e10 [64];
  undefined1 *local_1dd0;
  undefined1 in_stack_ffffffffffffe2a7;
  Geometry *in_stack_ffffffffffffe2a8;
  Array<const_MultiFab_*,_3> *in_stack_ffffffffffffe2b0;
  MultiFab *in_stack_ffffffffffffe2b8;
  FabArrayBase local_1d18;
  undefined1 local_1b74 [16];
  EBCellFlag *local_1b64;
  IndexType local_1b5c;
  RefID in_stack_ffffffffffffe4c8;
  pointer in_stack_ffffffffffffe4d0;
  Array4<double> *in_stack_ffffffffffffe4d8;
  _Head_base<0UL,_amrex::FabFactory<amrex::EBCellFlagFab>_*,_false> in_stack_ffffffffffffe4e0;
  DataAllocator dUdt_in;
  Array4<double> *in_stack_ffffffffffffe4f0;
  int in_stack_ffffffffffffe4fc;
  Box *in_stack_ffffffffffffe500;
  undefined1 local_1ac8 [112];
  EBCellFlagFab *local_1a58;
  MFIter local_1a50;
  IntVect local_19f0;
  Ref *local_19e0;
  int local_19d8;
  DataAllocator local_19d0;
  undefined1 auStack_19c8 [64];
  undefined1 auStack_1988 [64];
  undefined1 auStack_1948 [64];
  undefined1 auStack_1908 [64];
  undefined1 auStack_18c8 [64];
  undefined1 auStack_1888 [64];
  undefined1 auStack_1848 [64];
  undefined1 auStack_1808 [64];
  undefined1 auStack_17c8 [64];
  undefined1 local_1788 [64];
  undefined1 *local_1748;
  Array4<const_double> local_1740;
  Array4<const_double> local_1700;
  Array4<const_double> local_16c0;
  undefined1 local_1680 [128];
  Array4<const_double> local_1600;
  Array4<const_double> local_15c0 [4];
  Array4<const_double> local_14a8;
  int local_143c;
  undefined1 local_1438 [72];
  double local_13f0 [8];
  double *local_13b0;
  undefined1 local_13a8 [64];
  undefined1 *local_1368;
  undefined1 local_1360 [136];
  FabArray<amrex::FArrayBox> *local_12d8;
  undefined1 local_12d0 [136];
  Array4<double> *local_1248;
  undefined1 local_1240 [136];
  MFIter *local_11b8;
  Arena *local_11b0;
  undefined1 auStack_11a8 [64];
  undefined1 auStack_1168 [64];
  undefined1 auStack_1128 [64];
  undefined1 auStack_10e8 [24];
  Array4<const_amrex::EBCellFlag> *in_stack_ffffffffffffef30;
  Array4<const_double> *in_stack_ffffffffffffef38;
  Array4<const_double> *in_stack_ffffffffffffef40;
  Array4<const_double> *in_stack_ffffffffffffef48;
  Array4<const_double> *in_stack_ffffffffffffef50;
  Array4<const_double> *in_stack_ffffffffffffef58;
  Array4<const_double> *in_stack_ffffffffffffef60;
  Array4<const_double> *in_stack_ffffffffffffef68;
  Array4<const_double> *in_stack_ffffffffffffef70;
  BCRec *in_stack_ffffffffffffef78;
  Geometry *in_stack_ffffffffffffef80;
  string *in_stack_ffffffffffffef88;
  int in_stack_ffffffffffffef90;
  Array4<const_double> *in_stack_ffffffffffffef98;
  Array4<const_double> local_1020;
  Array4<const_double> local_fe0;
  Array4<const_double> local_fa0;
  undefined1 local_f60 [128];
  Array4<const_double> local_ee0;
  undefined8 local_ea0 [49];
  undefined1 local_d18 [64];
  undefined1 auStack_cd8 [64];
  FabArray<amrex::EBCellFlagFab> local_c98;
  pointer *local_b18;
  undefined1 local_b0c [28];
  undefined1 *local_af0;
  undefined1 local_ae4 [212];
  undefined1 local_a10 [64];
  undefined1 *local_9d0;
  undefined1 local_9c8 [64];
  undefined1 *local_988;
  Array4<double> local_980;
  Array4<double> *local_940;
  Array4<double> local_938;
  Array4<double> *local_8f8;
  Array4<double> local_8f0;
  Array4<double> *local_8b0;
  Array4<double> local_8a8;
  Array4<double> *local_868;
  Array4<double> local_860;
  Array4<double> *local_820;
  Array4<double> local_818;
  Array4<double> *local_7d8;
  Box local_7d0;
  byte local_7b1;
  EBCellFlagFab *local_7b0;
  int local_7a4 [7];
  int *local_788;
  MFIter local_780;
  undefined8 local_720;
  Box *local_700;
  undefined8 local_6f8;
  undefined8 uStack_6f0;
  undefined8 local_6e8;
  undefined8 uStack_6e0;
  undefined8 local_6d8;
  undefined8 local_548;
  undefined8 uStack_540;
  undefined8 local_538;
  undefined8 uStack_530;
  undefined8 local_528;
  undefined1 local_3a0 [24];
  undefined1 *local_388;
  MultiFab *local_380;
  MultiCutFab *local_378;
  undefined1 local_370 [24];
  undefined1 *local_358;
  FabArray<amrex::EBCellFlagFab> *local_350;
  MultiCutFab *local_348;
  Arena *local_330;
  int *local_328;
  int *local_320;
  PODVector<int,_std::allocator<int>_> local_310;
  byte local_2f2;
  byte local_2f1;
  byte local_2e1;
  Array4<double> *local_2e0;
  FabArrayBase *local_2d0;
  uint local_2c8;
  Array4<const_double> *local_2c0;
  undefined8 local_2b8;
  undefined4 local_2ac;
  char *local_2a8;
  char *local_2a0;
  undefined4 local_294;
  EBCellFlagFab *local_290;
  int local_284;
  int *local_280;
  undefined4 local_274;
  int *local_270;
  EBCellFlagFab *local_268;
  Array4<double> local_260;
  int local_21c;
  undefined1 *local_218;
  Dim3 local_210;
  Dim3 local_200;
  Dim3 local_1f0;
  Dim3 local_1e0;
  int local_1d4;
  undefined8 *local_1d0;
  double *local_1c8;
  Dim3 local_1c0;
  undefined8 *local_1b0;
  undefined4 local_1a8;
  undefined4 uStack_1a4;
  int local_1a0;
  undefined4 local_19c;
  undefined8 *local_198;
  undefined4 local_18c;
  undefined8 *local_188;
  undefined4 local_17c;
  undefined8 *local_178;
  Dim3 local_170;
  undefined8 *local_160;
  int local_158;
  int iStack_154;
  int local_150;
  undefined4 local_14c;
  undefined1 *local_148;
  undefined4 local_13c;
  undefined1 *local_138;
  undefined4 local_12c;
  int *local_128;
  Dim3 local_120;
  Dim3 local_10c;
  Dim3 local_100;
  Dim3 local_f0;
  int local_e4;
  Box *local_e0;
  EBCellFlag *local_d8;
  Dim3 local_d0;
  Box *local_c0;
  int local_b8;
  int iStack_b4;
  int local_b0;
  undefined4 local_ac;
  Box *local_a8;
  undefined4 local_9c;
  Box *local_98;
  undefined4 local_8c;
  Box *local_88;
  Dim3 local_80;
  Box *local_70;
  int local_68;
  int iStack_64;
  int local_60;
  undefined4 local_5c;
  IntVect *local_58;
  undefined4 local_4c;
  IntVect *local_48;
  undefined4 local_3c;
  IntVect *local_38;
  
  iVar21 = (int)((ulong)in_stack_ffffffffffffdbc0 >> 0x20);
  bVar14 = 0;
  local_2e1 = in_stack_00000038 & 1;
  local_2f1 = in_stack_00000098 & 1;
  local_2f2 = 1;
  local_2e0 = in_R9;
  local_2d0 = in_RCX;
  local_2c8 = in_EDX;
  local_2c0 = in_RDI;
  amrex::Vector<int,_std::allocator<int>_>::size((Vector<int,_std::allocator<int>_> *)0x7b5327);
  amrex::PODVector<int,_std::allocator<int>_>::PODVector
            ((PODVector<int,_std::allocator<int>_> *)in_stack_ffffffffffffd9a0,
             (size_type)in_stack_ffffffffffffd998);
  local_320 = (int *)std::vector<int,_std::allocator<int>_>::begin(in_stack_ffffffffffffd998);
  local_328 = (int *)std::vector<int,_std::allocator<int>_>::end(in_stack_ffffffffffffd998);
  piVar5 = amrex::PODVector<int,_std::allocator<int>_>::begin(&local_310);
  amrex::Gpu::copy<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int*>
            (local_320,local_328,piVar5);
  local_330 = (Arena *)amrex::PODVector<int,_std::allocator<int>_>::data(&local_310);
  bVar3 = amrex::FabArray<amrex::FArrayBox>::hasEBFabFactory(in_stack_ffffffffffffd9b0);
  if (!bVar3) {
    local_2a0 = "state.hasEBFabFactory()";
    local_2a8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/AMReX-Hydro/EBGodunov/hydro_ebgodunov.cpp"
    ;
    local_2ac = 0x34;
    local_2b8 = 0;
    amrex::Assert_host((char *)CONCAT44(in_stack_ffffffffffffdbd4,in_stack_ffffffffffffdbd0),
                       in_stack_ffffffffffffdbc8,iVar21,(char *)in_stack_ffffffffffffdbb8);
  }
  pFVar6 = amrex::FabArray<amrex::FArrayBox>::Factory((FabArray<amrex::FArrayBox> *)0x7b541c);
  local_348 = (MultiCutFab *)
              __dynamic_cast(pFVar6,&amrex::FabFactory<amrex::FArrayBox>::typeinfo,
                             &amrex::EBFArrayBoxFactory::typeinfo,0);
  if (local_348 == (MultiCutFab *)0x0) {
    __cxa_bad_cast();
  }
  local_350 = amrex::EBFArrayBoxFactory::getMultiEBCellFlagFab
                        ((EBFArrayBoxFactory *)in_stack_ffffffffffffd9a0);
  amrex::EBFArrayBoxFactory::getFaceCent((EBFArrayBoxFactory *)in_stack_ffffffffffffd9a0);
  local_358 = local_370;
  local_378 = amrex::EBFArrayBoxFactory::getCentroid
                        ((EBFArrayBoxFactory *)in_stack_ffffffffffffd9a0);
  local_380 = amrex::EBFArrayBoxFactory::getVolFrac((EBFArrayBoxFactory *)in_stack_ffffffffffffd9a0)
  ;
  amrex::EBFArrayBoxFactory::getAreaFrac((EBFArrayBoxFactory *)in_stack_ffffffffffffd9a0);
  local_388 = local_3a0;
  amrex::FabArrayBase::boxArray(local_2d0);
  amrex::FabArrayBase::DistributionMap(local_2d0);
  local_538 = 0;
  uStack_530 = 0;
  local_548 = 0;
  uStack_540 = 0;
  local_528 = 0;
  amrex::MFInfo::MFInfo((MFInfo *)0x7b5560);
  pMVar16 = local_348;
  amrex::MultiFab::MultiFab
            ((MultiFab *)in_stack_ffffffffffffd9e0,in_stack_ffffffffffffd9d8,
             (DistributionMapping *)in_stack_ffffffffffffd9d0,
             (int)((ulong)in_stack_ffffffffffffd9c8 >> 0x20),(int)in_stack_ffffffffffffd9c8,
             (MFInfo *)in_stack_ffffffffffffd9c0,
             (FabFactory<amrex::FArrayBox> *)in_stack_ffffffffffffd9f0);
  amrex::MFInfo::~MFInfo((MFInfo *)0x7b55af);
  amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
            ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffd9a0,(value_type)pMVar16);
  amrex::FabArrayBase::boxArray(local_2d0);
  amrex::FabArrayBase::DistributionMap(local_2d0);
  local_6e8 = 0;
  uStack_6e0 = 0;
  local_6f8 = 0;
  uStack_6f0 = 0;
  local_6d8 = 0;
  amrex::MFInfo::MFInfo((MFInfo *)0x7b561f);
  pMVar16 = local_348;
  amrex::MultiFab::MultiFab
            ((MultiFab *)in_stack_ffffffffffffd9e0,in_stack_ffffffffffffd9d8,
             (DistributionMapping *)in_stack_ffffffffffffd9d0,
             (int)((ulong)in_stack_ffffffffffffd9c8 >> 0x20),(int)in_stack_ffffffffffffd9c8,
             (MFInfo *)in_stack_ffffffffffffd9c0,
             (FabFactory<amrex::FArrayBox> *)in_stack_ffffffffffffd9f0);
  amrex::MFInfo::~MFInfo((MFInfo *)0x7b5669);
  local_700 = (Box *)0x0;
  do {
    bx_00 = local_700;
    LVar7 = amrex::Vector<int,_std::allocator<int>_>::size
                      ((Vector<int,_std::allocator<int>_> *)0x7b5692);
    if (LVar7 <= (long)bx_00) {
LAB_007b585d:
      local_720 = 0xbff0000000000000;
      amrex::TilingIfNotGPU();
      amrex::MFIter::MFIter
                ((MFIter *)in_stack_ffffffffffffd9d0,in_stack_ffffffffffffd9c8,
                 SUB81((ulong)in_stack_ffffffffffffd9c0 >> 0x38,0));
      umac_00 = local_2c0;
      while (bVar3 = amrex::MFIter::isValid(&local_780), bVar3) {
        amrex::MFIter::tilebox((MFIter *)in_stack_ffffffffffffda00);
        local_788 = local_7a4;
        amrex::EBFArrayBoxFactory::getMultiEBCellFlagFab
                  ((EBFArrayBoxFactory *)in_stack_ffffffffffffd9a0);
        pEVar10 = amrex::FabArray<amrex::EBCellFlagFab>::operator[]
                            ((FabArray<amrex::EBCellFlagFab> *)in_stack_ffffffffffffd9a0,
                             (MFIter *)pMVar16);
        local_270 = local_788;
        local_274 = 3;
        local_7d0.smallend.vect._0_8_ = *(undefined8 *)local_788;
        local_7d0.smallend.vect[2] = local_788[2];
        local_7d0.bigend.vect[0] = local_788[3];
        local_7d0.bigend.vect._4_8_ = *(undefined8 *)(local_788 + 4);
        local_7d0.btype.itype = local_788[6];
        local_7b0 = pEVar10;
        amrex::Box::grow(&local_7d0,3);
        FVar4 = amrex::EBCellFlagFab::getType
                          (in_stack_ffffffffffffdac8,
                           (Box *)CONCAT44(in_stack_ffffffffffffdac4,in_stack_ffffffffffffdac0));
        local_7b1 = FVar4 == regular;
        amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  (in_stack_ffffffffffffd9b0,(MFIter *)in_stack_ffffffffffffd9a8,
                   (int)((ulong)in_stack_ffffffffffffd9a0 >> 0x20));
        local_7d8 = &local_818;
        amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  (in_stack_ffffffffffffd9b0,(MFIter *)in_stack_ffffffffffffd9a8,
                   (int)((ulong)in_stack_ffffffffffffd9a0 >> 0x20));
        local_820 = &local_860;
        amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  (in_stack_ffffffffffffd9b0,(MFIter *)in_stack_ffffffffffffd9a8,
                   (int)((ulong)in_stack_ffffffffffffd9a0 >> 0x20));
        local_868 = &local_8a8;
        amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  (in_stack_ffffffffffffd9b0,(MFIter *)in_stack_ffffffffffffd9a8,
                   (int)((ulong)in_stack_ffffffffffffd9a0 >> 0x20));
        local_8b0 = &local_8f0;
        amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  (in_stack_ffffffffffffd9b0,(MFIter *)in_stack_ffffffffffffd9a8,
                   (int)((ulong)in_stack_ffffffffffffd9a0 >> 0x20));
        local_8f8 = &local_938;
        amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  (in_stack_ffffffffffffd9b0,(MFIter *)in_stack_ffffffffffffd9a8,
                   (int)((ulong)in_stack_ffffffffffffd9a0 >> 0x20));
        local_940 = (Array4<double> *)(local_ae4 + 0x164);
        amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffd9a8,
                   (MFIter *)in_stack_ffffffffffffd9a0);
        local_988 = local_ae4 + 0x11c;
        amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffd9a8,
                   (MFIter *)in_stack_ffffffffffffd9a0);
        local_9d0 = local_ae4 + 0xd4;
        amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffd9a8,
                   (MFIter *)in_stack_ffffffffffffd9a0);
        local_ae4._204_8_ = local_ae4 + 0x8c;
        amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffd9a8,
                   (MFIter *)in_stack_ffffffffffffd9a0);
        FVar4 = amrex::EBCellFlagFab::getType
                          (in_stack_ffffffffffffdac8,
                           (Box *)CONCAT44(in_stack_ffffffffffffdac4,in_stack_ffffffffffffdac0));
        if (FVar4 == covered) {
          amrex::MFIter::nodaltilebox
                    (in_stack_ffffffffffffda10,(int)((ulong)in_stack_ffffffffffffda08 >> 0x20));
          iVar21 = (int)((ulong)in_stack_ffffffffffffd9a0 >> 0x20);
          local_ae4._68_8_ = local_ae4 + 0x28;
          amrex::MFIter::nodaltilebox
                    (in_stack_ffffffffffffda10,(int)((ulong)in_stack_ffffffffffffda08 >> 0x20));
          local_ae4._28_8_ = local_ae4;
          amrex::MFIter::nodaltilebox
                    (in_stack_ffffffffffffda10,(int)((ulong)in_stack_ffffffffffffda08 >> 0x20));
          local_af0 = local_b0c;
          amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                    (in_stack_ffffffffffffd9b0,(MFIter *)in_stack_ffffffffffffd9a8,iVar21);
          local_b18 = (pointer *)
                      ((long)&local_c98.m_tags.
                              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data + 8);
          memcpy(&local_c98.define_function_called,local_b18,0x3c);
          memcpy(&local_c98.super_FabArrayBase.indexArray,local_7d8,0x3c);
          memcpy(&local_c98.super_FabArrayBase.n_grow,local_8b0,0x3c);
          uVar2 = local_2c8;
          pMVar16 = (MultiCutFab *)local_ae4._28_8_;
          memcpy(&local_c98,local_820,0x3c);
          memcpy((void *)((long)&local_c98.super_FabArrayBase.boxarray.m_bat.m_op + 0x34),local_8f8,
                 0x3c);
          in_stack_ffffffffffffd9a8 = &local_c98;
          in_stack_ffffffffffffd9a0 = (MultiCutFab *)CONCAT44(iVar21,uVar2);
          amrex::
          ParallelFor<int,int,int,EBGodunov::ComputeAofs(amrex::MultiFab&,int,int,amrex::MultiFab_const&,int,amrex::MultiFab_const&,amrex::MultiFab_const&,amrex::MultiFab_const&,amrex::MultiFab&,amrex::MultiFab&,amrex::MultiFab&,int,bool,amrex::MultiFab&,amrex::MultiFab&,amrex::MultiFab&,int,amrex::MultiFab_const&,int,amrex::MultiFab_const&,amrex::Vector<amrex::BCRec,std::allocator<amrex::BCRec>>const&,amrex::BCRec_const*,amrex::Geometry_const&,amrex::Vector<int,std::allocator<int>>&,double,bool,std::__cxx11::string)::__0,EBGodunov::ComputeAofs(amrex::MultiFab&,int,int,amrex::MultiFab_const&,int,amrex::MultiFab_const&,amrex::MultiFab_const&,amrex::MultiFab_const&,amrex::MultiFab&,amrex::MultiFab&,amrex::MultiFab&,int,bool,amrex::MultiFab&,amrex::MultiFab&,amrex::MultiFab&,int,amrex::MultiFab_const&,int,amrex::MultiFab_const&,amrex::Vector<amrex::BCRec,std::allocator<amrex::BCRec>>const&,amrex::BCRec_const*,amrex::Geometry_const&,amrex::Vector<int,std::allocator<int>>&,double,bool,std::__cxx11::string)::__1,EBGodunov::ComputeAofs(amrex::MultiFab&,int,int,amrex::MultiFab_const&,int,amrex::MultiFab_const&,amrex::MultiFab_const&,amrex::MultiFab_const&,amrex::MultiFab&,amrex::MultiFab&,amrex::MultiFab&,int,bool,amrex::MultiFab&,amrex::MultiFab&,amrex::MultiFab&,int,amrex::MultiFab_const&,int,amrex::MultiFab_const&,amrex::Vector<amrex::BCRec,std::allocator<amrex::BCRec>>const&,amrex::BCRec_const*,amrex::Geometry_const&,amrex::Vector<int,std::allocator<int>>&,double,bool,std::__cxx11::string)::__2,void,void,void>
                    ((Box *)in_stack_ffffffffffffd9c0,
                     (int)((ulong)in_stack_ffffffffffffd9b8 >> 0x20),
                     (anon_class_64_1_e8a15f1b *)in_stack_ffffffffffffd9b0,
                     (Box *)in_stack_ffffffffffffd9a8,iVar21,(anon_class_128_2_7b0e3944 *)pMVar16,
                     (Box *)in_stack_ffffffffffffd9d0,(int)in_stack_ffffffffffffd9d8,
                     (anon_class_128_2_7b0e3d24 *)in_stack_ffffffffffffd9e0);
          in_stack_ffffffffffffde8c = local_2c8;
          memcpy(local_d18,local_868,0x3c);
          memcpy(auStack_cd8,local_940,0x3c);
          amrex::
          ParallelFor<int,EBGodunov::ComputeAofs(amrex::MultiFab&,int,int,amrex::MultiFab_const&,int,amrex::MultiFab_const&,amrex::MultiFab_const&,amrex::MultiFab_const&,amrex::MultiFab&,amrex::MultiFab&,amrex::MultiFab&,int,bool,amrex::MultiFab&,amrex::MultiFab&,amrex::MultiFab&,int,amrex::MultiFab_const&,int,amrex::MultiFab_const&,amrex::Vector<amrex::BCRec,std::allocator<amrex::BCRec>>const&,amrex::BCRec_const*,amrex::Geometry_const&,amrex::Vector<int,std::allocator<int>>&,double,bool,std::__cxx11::string)::__3,void>
                    ((Box *)in_stack_ffffffffffffd9f0,
                     (int)((ulong)in_stack_ffffffffffffd9e8 >> 0x20),
                     (anon_class_128_2_7b0e4104 *)in_stack_ffffffffffffd9e0);
        }
        else if ((local_7b1 & 1) == 0) {
          in_stack_ffffffffffffdd30 = (Array4<double> *)0x0;
          std::array<const_amrex::MultiCutFab_*,_3UL>::operator[]
                    ((array<const_amrex::MultiCutFab_*,_3UL> *)in_stack_ffffffffffffd9a0,
                     (size_type)pMVar16);
          uVar18 = (undefined4)((ulong)in_stack_ffffffffffffd9e8 >> 0x20);
          in_stack_ffffffffffffdd18 = (MFIter *)(local_1240 + 0x48);
          amrex::MultiCutFab::const_array(in_stack_ffffffffffffd9a0,(MFIter *)pMVar16);
          local_11b8 = in_stack_ffffffffffffdd18;
          std::array<const_amrex::MultiCutFab_*,_3UL>::operator[]
                    ((array<const_amrex::MultiCutFab_*,_3UL> *)in_stack_ffffffffffffd9a0,
                     (size_type)pMVar16);
          in_stack_ffffffffffffdd20 = (BARef *)local_1240;
          amrex::MultiCutFab::const_array(in_stack_ffffffffffffd9a0,(MFIter *)pMVar16);
          local_1240._64_8_ = in_stack_ffffffffffffdd20;
          std::array<const_amrex::MultiCutFab_*,_3UL>::operator[]
                    ((array<const_amrex::MultiCutFab_*,_3UL> *)in_stack_ffffffffffffd9a0,
                     (size_type)pMVar16);
          in_stack_ffffffffffffdd28 = (Array4<double> *)(local_12d0 + 0x48);
          amrex::MultiCutFab::const_array(in_stack_ffffffffffffd9a0,(MFIter *)pMVar16);
          local_1248 = in_stack_ffffffffffffdd28;
          std::array<const_amrex::MultiCutFab_*,_3UL>::operator[]
                    ((array<const_amrex::MultiCutFab_*,_3UL> *)in_stack_ffffffffffffd9a0,
                     (size_type)pMVar16);
          in_stack_ffffffffffffdd38 = (MultiCutFab *)local_12d0;
          amrex::MultiCutFab::const_array(in_stack_ffffffffffffd9a0,(MFIter *)pMVar16);
          local_12d0._64_8_ = in_stack_ffffffffffffdd38;
          std::array<const_amrex::MultiCutFab_*,_3UL>::operator[]
                    ((array<const_amrex::MultiCutFab_*,_3UL> *)in_stack_ffffffffffffd9a0,
                     (size_type)pMVar16);
          amrex::MultiCutFab::const_array(in_stack_ffffffffffffd9a0,(MFIter *)pMVar16);
          local_12d8 = (FabArray<amrex::FArrayBox> *)(local_1360 + 0x48);
          std::array<const_amrex::MultiCutFab_*,_3UL>::operator[]
                    ((array<const_amrex::MultiCutFab_*,_3UL> *)in_stack_ffffffffffffd9a0,
                     (size_type)pMVar16);
          amrex::MultiCutFab::const_array(in_stack_ffffffffffffd9a0,(MFIter *)pMVar16);
          local_1360._64_8_ = (FabArrayBase *)local_1360;
          amrex::MultiCutFab::const_array(in_stack_ffffffffffffd9a0,(MFIter *)pMVar16);
          local_1368 = local_13a8;
          amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffd9a8,
                     (MFIter *)in_stack_ffffffffffffd9a0);
          local_13b0 = local_13f0;
          amrex::FabArray<amrex::EBCellFlagFab>::const_array<amrex::EBCellFlagFab,_0>
                    (in_stack_ffffffffffffd9a8,(MFIter *)in_stack_ffffffffffffd9a0);
          local_143c = 4;
          local_1438._64_8_ = (anon_class_584_10_5c229435 *)local_1438;
          bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_ffffffffffffd9a0,(char *)pMVar16);
          if (bVar3) {
            local_143c = local_143c + 1;
          }
          local_280 = local_788;
          local_284 = local_143c;
          local_14a8.p = *(double **)local_788;
          local_14a8._20_8_ = *(undefined8 *)(local_788 + 5);
          local_14a8.kstride._0_4_ = (undefined4)((ulong)*(undefined8 *)(local_788 + 3) >> 0x20);
          local_14a8.jstride._0_4_ = (undefined4)*(undefined8 *)(local_788 + 2);
          local_14a8.jstride._4_4_ = (undefined4)((ulong)*(undefined8 *)(local_788 + 2) >> 0x20);
          in_stack_ffffffffffffdd10 = &local_14a8;
          amrex::Box::grow((Box *)in_stack_ffffffffffffdd10,local_143c);
          amrex::FArrayBox::FArrayBox
                    ((FArrayBox *)in_stack_ffffffffffffd9b0,(Box *)in_stack_ffffffffffffd9a8,
                     (int)((ulong)in_stack_ffffffffffffd9a0 >> 0x20),
                     SUB81((ulong)in_stack_ffffffffffffd9a0 >> 0x18,0),
                     SUB81((ulong)in_stack_ffffffffffffd9a0 >> 0x10,0),(Arena *)pMVar16);
          amrex::BaseFab<double>::elixir<double,_0>((BaseFab<double> *)in_stack_ffffffffffffd9c8);
          if ((local_2e1 & 1) == 0) {
            amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                      (in_stack_ffffffffffffd9b0,(MFIter *)in_stack_ffffffffffffd9a8,
                       (int)((ulong)in_stack_ffffffffffffd9a0 >> 0x20));
            in_stack_ffffffffffffdd08 = local_8b0;
            amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                      ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffd9a8,
                       (MFIter *)in_stack_ffffffffffffd9a0);
            amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                      (in_stack_ffffffffffffd9b0,(MFIter *)in_stack_ffffffffffffd9a8,
                       (int)((ulong)in_stack_ffffffffffffd9a0 >> 0x20));
            amrex::BaseFab<double>::dataPtr
                      ((BaseFab<double> *)in_stack_ffffffffffffd9b8,
                       (int)((ulong)in_stack_ffffffffffffd9b0 >> 0x20));
            in_stack_ffffffffffffda10 = local_11b8;
            in_stack_ffffffffffffd9f0 = (MultiCutFab *)local_12d0._64_8_;
            in_stack_ffffffffffffda00 = (FabArrayBase *)local_1360._64_8_;
            in_stack_ffffffffffffda08 = local_13b0;
            paVar20 = (anon_class_584_10_5c229435 *)local_1438._64_8_;
            amrex::Array4<const_double>::Array4(local_15c0);
            ComputeEdgeState(in_stack_00000bb8,in_stack_00000bb4,in_stack_00000ba8,in_stack_00000ba0
                             ,aofs_arr_1,in_stack_00000b90,in_stack_000023f0,in_stack_000023f8,
                             in_stack_00002400,in_stack_00002408,in_stack_00002410,in_stack_00002418
                             ,in_stack_00000b88,in_stack_00002420,in_stack_00002428,
                             in_stack_00002430,in_stack_00002438,in_stack_00002440,in_stack_00002448
                             ,in_stack_00002450,in_stack_00002458,in_stack_00002460,
                             in_stack_00002468,in_stack_00002470,in_stack_00002478,in_stack_00002480
                             ,(bool)in_stack_00000b87,in_stack_00002490);
            uVar18 = (undefined4)((ulong)paVar20 >> 0x20);
          }
          puVar15 = (undefined1 *)local_ae4._204_8_;
          amrex::Array4<const_double>::Array4<const_double,_0>(&local_1600,local_8b0);
          pAVar17 = (Array4<const_double> *)(local_1680 + 0x40);
          amrex::Array4<const_double>::Array4<const_double,_0>(pAVar17,local_8f8);
          in_stack_ffffffffffffd9b0 = (FabArray<amrex::FArrayBox> *)local_1680;
          amrex::Array4<const_double>::Array4<const_double,_0>
                    ((Array4<const_double> *)in_stack_ffffffffffffd9b0,local_940);
          in_stack_ffffffffffffd9e8 =
               (MultiCutFab *)(CONCAT44(uVar18,(uint)local_2f2) & 0xffffffff00000001);
          in_stack_ffffffffffffd9d8 = (BoxArray *)(ulong)local_2c8;
          in_stack_ffffffffffffd9b8 = (MultiCutFab *)local_12d0._64_8_;
          in_stack_ffffffffffffd9c0 = local_12d8;
          in_stack_ffffffffffffd9c8 = (FabArrayBase *)local_1360._64_8_;
          in_stack_ffffffffffffd9d0 = in_stack_00000088;
          in_stack_ffffffffffffd9e0 = (anon_class_584_10_5c229435 *)local_1438._64_8_;
          HydroUtils::EB_ComputeFluxes
                    (bx_00,in_stack_ffffffffffffdeb0,in_stack_ffffffffffffdea8,
                     in_stack_ffffffffffffdea0,umac_00,(Array4<const_double> *)pEVar10,
                     in_stack_ffffffffffffe0c0,in_stack_ffffffffffffe0c8,in_stack_ffffffffffffe0d0,
                     in_stack_ffffffffffffe0d8,in_stack_ffffffffffffe0e0,in_stack_ffffffffffffe0e8,
                     in_stack_ffffffffffffe0f0,(Geometry *)in_stack_ffffffffffffe0f8.data,
                     in_stack_ffffffffffffe100,in_stack_ffffffffffffe108,
                     SUB41(in_stack_ffffffffffffde8c >> 0x18,0));
          uVar18 = (undefined4)((ulong)puVar15 >> 0x20);
          uVar19 = (undefined4)((ulong)pAVar17 >> 0x20);
          amrex::Array4<const_double>::Array4<const_double,_0>(&local_16c0,local_7d8);
          amrex::Array4<const_double>::Array4<const_double,_0>(&local_1700,local_820);
          amrex::Array4<const_double>::Array4<const_double,_0>(&local_1740,local_868);
          in_stack_ffffffffffffd9a8 =
               (FabArray<amrex::EBCellFlagFab> *)
               (CONCAT44(uVar19,(uint)local_2f2) & 0xffffffff00000001);
          pMVar16 = (MultiCutFab *)CONCAT44(uVar18,local_2c8);
          in_stack_ffffffffffffd9a0 = in_stack_00000088;
          HydroUtils::EB_ComputeDivergence
                    (in_stack_ffffffffffffdb70,in_stack_ffffffffffffdb68,in_stack_ffffffffffffdb60,
                     in_stack_ffffffffffffdb58,in_stack_ffffffffffffdb50,in_stack_ffffffffffffdb48,
                     (int)in_stack_ffffffffffffdbb0,in_stack_ffffffffffffdbb8,
                     (Real)CONCAT17(in_stack_ffffffffffffdb47,
                                    CONCAT16(in_stack_ffffffffffffdb46,in_stack_ffffffffffffdb40)),
                     SUB81((ulong)in_stack_ffffffffffffdb38 >> 0x38,0));
          amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                    ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffd9a8,
                     (MFIter *)in_stack_ffffffffffffd9a0);
          local_1748 = local_1788;
          local_19d0.m_arena = local_330;
          memcpy(auStack_19c8,local_13b0,0x3c);
          memcpy(auStack_1988,local_8b0,0x3c);
          memcpy(auStack_1948,(void *)local_12d0._64_8_,0x3c);
          memcpy(auStack_1908,local_8f8,0x3c);
          memcpy(auStack_18c8,local_12d8,0x3c);
          memcpy(auStack_1888,local_940,0x3c);
          memcpy(auStack_1848,(void *)local_1360._64_8_,0x3c);
          memcpy(auStack_1808,local_ae4 + 0x4c,0x3c);
          memcpy(auStack_17c8,local_1748,0x3c);
          amrex::
          ParallelFor<int,EBGodunov::ComputeAofs(amrex::MultiFab&,int,int,amrex::MultiFab_const&,int,amrex::MultiFab_const&,amrex::MultiFab_const&,amrex::MultiFab_const&,amrex::MultiFab&,amrex::MultiFab&,amrex::MultiFab&,int,bool,amrex::MultiFab&,amrex::MultiFab&,amrex::MultiFab&,int,amrex::MultiFab_const&,int,amrex::MultiFab_const&,amrex::Vector<amrex::BCRec,std::allocator<amrex::BCRec>>const&,amrex::BCRec_const*,amrex::Geometry_const&,amrex::Vector<int,std::allocator<int>>&,double,bool,std::__cxx11::string)::__5,void>
                    ((Box *)in_stack_ffffffffffffd9f0,
                     (int)((ulong)in_stack_ffffffffffffd9e8 >> 0x20),in_stack_ffffffffffffd9e0);
          amrex::Gpu::Elixir::~Elixir((Elixir *)in_stack_ffffffffffffd9a0);
          amrex::FArrayBox::~FArrayBox((FArrayBox *)0x7b6ddd);
        }
        else {
          if ((local_2e1 & 1) == 0) {
            amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                      (in_stack_ffffffffffffd9b0,(MFIter *)in_stack_ffffffffffffd9a8,
                       (int)((ulong)in_stack_ffffffffffffd9a0 >> 0x20));
            amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                      ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffd9a8,
                       (MFIter *)in_stack_ffffffffffffd9a0);
            amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                      (in_stack_ffffffffffffd9b0,(MFIter *)in_stack_ffffffffffffd9a8,
                       (int)((ulong)in_stack_ffffffffffffd9a0 >> 0x20));
            memcpy(local_ea0,in_stack_00000088,200);
            puVar12 = local_ea0;
            puVar13 = (undefined8 *)&stack0xffffffffffffd9c0;
            for (lVar11 = 0x19; lVar11 != 0; lVar11 = lVar11 + -1) {
              *puVar13 = *puVar12;
              puVar12 = puVar12 + (ulong)bVar14 * -2 + 1;
              puVar13 = puVar13 + (ulong)bVar14 * -2 + 1;
            }
            Godunov::ComputeEdgeState
                      ((Box *)tmpfab_1.super_BaseFab<double>.domain.smallend.vect._0_8_,
                       tmpfab_1.super_BaseFab<double>.dptr._4_4_,
                       (Array4<const_double> *)
                       tmpfab_1.super_BaseFab<double>.super_DataAllocator.m_arena,
                       (Array4<double> *)tmpfab_1.super_BaseFab<double>._vptr_BaseFab,
                       (Array4<double> *)
                       eli_1.m_pa.
                       super_vector<std::pair<void_*,_amrex::Arena_*>,_std::allocator<std::pair<void_*,_amrex::Arena_*>_>_>
                       .
                       super__Vector_base<std::pair<void_*,_amrex::Arena_*>,_std::allocator<std::pair<void_*,_amrex::Arena_*>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,
                       (Array4<double> *)
                       eli_1.m_pa.
                       super_vector<std::pair<void_*,_amrex::Arena_*>,_std::allocator<std::pair<void_*,_amrex::Arena_*>_>_>
                       .
                       super__Vector_base<std::pair<void_*,_amrex::Arena_*>,_std::allocator<std::pair<void_*,_amrex::Arena_*>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,
                       (Array4<const_double> *)
                       divu_mac.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.indexArray.
                       super_vector<int,_std::allocator<int>_>.
                       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                       ._M_start,
                       (Array4<const_double> *)
                       divu_mac.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.indexArray.
                       super_vector<int,_std::allocator<int>_>.
                       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                       ._M_finish,
                       (Array4<const_double> *)
                       divu_mac.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.indexArray.
                       super_vector<int,_std::allocator<int>_>.
                       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                       ._M_end_of_storage,
                       (Array4<const_double> *)
                       divu_mac.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.ownership.
                       super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                       _M_start.super__Bit_iterator_base._M_p,
                       (Array4<const_double> *)
                       divu_mac.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.ownership.
                       super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                       _M_start.super__Bit_iterator_base._8_8_,
                       (Geometry)divu_mac.super_FabArray<amrex::FArrayBox>._168_200_,
                       (Real)eli_1.m_pa.
                             super_vector<std::pair<void_*,_amrex::Arena_*>,_std::allocator<std::pair<void_*,_amrex::Arena_*>_>_>
                             .
                             super__Vector_base<std::pair<void_*,_amrex::Arena_*>,_std::allocator<std::pair<void_*,_amrex::Arena_*>_>_>
                             ._M_impl.super__Vector_impl_data._M_start,
                       (BCRec *)divu_mac.super_FabArray<amrex::FArrayBox>.pcd._M_t.
                                super___uniq_ptr_impl<amrex::PCData<amrex::FArrayBox>,_std::default_delete<amrex::PCData<amrex::FArrayBox>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_amrex::PCData<amrex::FArrayBox>_*,_std::default_delete<amrex::PCData<amrex::FArrayBox>_>_>
                                .super__Head_base<0UL,_amrex::PCData<amrex::FArrayBox>_*,_false>.
                                _M_head_impl,
                       (int *)divu_mac.super_FabArray<amrex::FArrayBox>.os_temp._M_t.
                              super___uniq_ptr_impl<amrex::FabArray<amrex::FArrayBox>,_std::default_delete<amrex::FabArray<amrex::FArrayBox>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_amrex::FabArray<amrex::FArrayBox>_*,_std::default_delete<amrex::FabArray<amrex::FArrayBox>_>_>
                              .super__Head_base<0UL,_amrex::FabArray<amrex::FArrayBox>_*,_false>.
                              _M_head_impl,(bool)scratch._63_1_,(bool)scratch._62_1_,
                       (bool)scratch._61_1_);
          }
          uVar18 = (undefined4)((ulong)in_stack_ffffffffffffd9c0 >> 0x20);
          uVar19 = (undefined4)((ulong)in_stack_ffffffffffffd9c8 >> 0x20);
          pAVar17 = &local_ee0;
          amrex::Array4<const_double>::Array4<const_double,_0>(pAVar17,local_8b0);
          in_stack_ffffffffffffd9a8 = (FabArray<amrex::EBCellFlagFab> *)(local_f60 + 0x40);
          amrex::Array4<const_double>::Array4<const_double,_0>
                    ((Array4<const_double> *)in_stack_ffffffffffffd9a8,local_8f8);
          in_stack_ffffffffffffd9b0 = (FabArray<amrex::FArrayBox> *)local_f60;
          amrex::Array4<const_double>::Array4<const_double,_0>
                    ((Array4<const_double> *)in_stack_ffffffffffffd9b0,local_940);
          in_stack_ffffffffffffd9c8 =
               (FabArrayBase *)(CONCAT44(uVar19,(uint)local_2f2) & 0xffffffff00000001);
          in_stack_ffffffffffffd9c0 = (FabArray<amrex::FArrayBox> *)CONCAT44(uVar18,local_2c8);
          in_stack_ffffffffffffd9b8 = in_stack_00000088;
          HydroUtils::ComputeFluxes
                    ((Box *)in_stack_ffffffffffffdd38,in_stack_ffffffffffffdd30,
                     in_stack_ffffffffffffdd28,(Array4<double> *)in_stack_ffffffffffffdd20,
                     (Array4<const_double> *)in_stack_ffffffffffffdd18,in_stack_ffffffffffffdd10,
                     in_stack_ffffffffffffdf40,in_stack_ffffffffffffdf48,in_stack_ffffffffffffdf50,
                     in_stack_ffffffffffffdf58,in_stack_ffffffffffffdf60,in_stack_ffffffffffffdf68,
                     SUB81((ulong)in_stack_ffffffffffffdd08 >> 0x38,0));
          uVar18 = (undefined4)((ulong)pAVar17 >> 0x20);
          amrex::Array4<const_double>::Array4<const_double,_0>(&local_fa0,local_7d8);
          amrex::Array4<const_double>::Array4<const_double,_0>(&local_fe0,local_820);
          amrex::Array4<const_double>::Array4<const_double,_0>(&local_1020,local_868);
          in_stack_ffffffffffffd9a0 =
               (MultiCutFab *)(CONCAT44(uVar18,(uint)local_2f2) & 0xffffffff00000001);
          pMVar16 = in_stack_00000088;
          HydroUtils::ComputeDivergence
                    (in_stack_ffffffffffffdb30,in_stack_ffffffffffffdb28,in_stack_ffffffffffffdb20,
                     in_stack_ffffffffffffdb18,in_stack_ffffffffffffdb10,
                     (int)((ulong)in_stack_ffffffffffffdb08 >> 0x20),
                     (Geometry *)CONCAT17(in_stack_ffffffffffffdba7,in_stack_ffffffffffffdba0),
                     in_stack_ffffffffffffdb00,SUB81((ulong)in_stack_ffffffffffffdaf8 >> 0x38,0));
          amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                    ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffd9a8,
                     (MFIter *)in_stack_ffffffffffffd9a0);
          local_11b0 = local_330;
          memcpy(auStack_11a8,local_8b0,0x3c);
          memcpy(auStack_1168,local_8f8,0x3c);
          memcpy(auStack_1128,local_940,0x3c);
          memcpy(auStack_10e8,local_ae4 + 0x4c,0x3c);
          memcpy(&stack0xffffffffffffef58,&stack0xffffffffffffef98,0x3c);
          amrex::
          ParallelFor<int,EBGodunov::ComputeAofs(amrex::MultiFab&,int,int,amrex::MultiFab_const&,int,amrex::MultiFab_const&,amrex::MultiFab_const&,amrex::MultiFab_const&,amrex::MultiFab&,amrex::MultiFab&,amrex::MultiFab&,int,bool,amrex::MultiFab&,amrex::MultiFab&,amrex::MultiFab&,int,amrex::MultiFab_const&,int,amrex::MultiFab_const&,amrex::Vector<amrex::BCRec,std::allocator<amrex::BCRec>>const&,amrex::BCRec_const*,amrex::Geometry_const&,amrex::Vector<int,std::allocator<int>>&,double,bool,std::__cxx11::string)::__4,void>
                    ((Box *)in_stack_ffffffffffffd9f0,
                     (int)((ulong)in_stack_ffffffffffffd9e8 >> 0x20),
                     (anon_class_328_6_4fbb0821 *)in_stack_ffffffffffffd9e0);
        }
        amrex::MFIter::operator++(&local_780);
      }
      amrex::MFIter::~MFIter((MFIter *)in_stack_ffffffffffffd9a0);
      local_19f0.vect =
           (int  [3])amrex::Geometry::periodicity((Geometry *)in_stack_ffffffffffffd9d0);
      local_19d8 = local_19f0.vect[2];
      local_19e0 = (Ref *)local_19f0.vect._0_8_;
      amrex::FabArray<amrex::FArrayBox>::FillBoundary<double>
                (in_stack_ffffffffffffd9c0,(Periodicity *)in_stack_ffffffffffffd9b8,
                 SUB81((ulong)in_stack_ffffffffffffd9b0 >> 0x38,0));
      do_tiling_ = (undefined1)((ulong)in_stack_ffffffffffffd9c0 >> 0x38);
      amrex::TilingIfNotGPU();
      amrex::MFIter::MFIter
                ((MFIter *)in_stack_ffffffffffffd9d0,in_stack_ffffffffffffd9c8,(bool)do_tiling_);
      while (bVar3 = amrex::MFIter::isValid(&local_1a50), bVar3) {
        pEVar10 = (EBCellFlagFab *)(local_1ac8 + 0x54);
        amrex::MFIter::tilebox((MFIter *)in_stack_ffffffffffffda00);
        local_1a58 = pEVar10;
        amrex::EBFArrayBoxFactory::getMultiEBCellFlagFab
                  ((EBFArrayBoxFactory *)in_stack_ffffffffffffd9a0);
        local_1ac8._72_8_ =
             amrex::FabArray<amrex::EBCellFlagFab>::operator[]
                       ((FabArray<amrex::EBCellFlagFab> *)in_stack_ffffffffffffd9a0,
                        (MFIter *)pMVar16);
        local_d8 = (((EBCellFlagFab *)local_1ac8._72_8_)->super_BaseFab<amrex::EBCellFlag>).dptr;
        local_e0 = &(((EBCellFlagFab *)local_1ac8._72_8_)->super_BaseFab<amrex::EBCellFlag>).domain;
        local_e4 = (((EBCellFlagFab *)local_1ac8._72_8_)->super_BaseFab<amrex::EBCellFlag>).nvar;
        local_8c = 0;
        local_b8 = (local_e0->smallend).vect[0];
        local_9c = 1;
        iStack_b4 = (((EBCellFlagFab *)local_1ac8._72_8_)->super_BaseFab<amrex::EBCellFlag>).domain.
                    smallend.vect[1];
        local_100.x = (local_e0->smallend).vect[0];
        local_100.y = (local_e0->smallend).vect[1];
        local_ac = 2;
        local_100.z = (((EBCellFlagFab *)local_1ac8._72_8_)->super_BaseFab<amrex::EBCellFlag>).
                      domain.smallend.vect[2];
        local_38 = &(((EBCellFlagFab *)local_1ac8._72_8_)->super_BaseFab<amrex::EBCellFlag>).domain.
                    bigend;
        local_3c = 0;
        local_68 = local_38->vect[0] + 1;
        local_48 = &(((EBCellFlagFab *)local_1ac8._72_8_)->super_BaseFab<amrex::EBCellFlag>).domain.
                    bigend;
        local_4c = 1;
        iStack_64 = (((EBCellFlagFab *)local_1ac8._72_8_)->super_BaseFab<amrex::EBCellFlag>).domain.
                    bigend.vect[1] + 1;
        local_58 = &(((EBCellFlagFab *)local_1ac8._72_8_)->super_BaseFab<amrex::EBCellFlag>).domain.
                    bigend;
        local_5c = 2;
        local_120.z = (((EBCellFlagFab *)local_1ac8._72_8_)->super_BaseFab<amrex::EBCellFlag>).
                      domain.bigend.vect[2] + 1;
        local_120.y = iStack_64;
        local_120.x = local_68;
        local_268 = (EBCellFlagFab *)local_1ac8._72_8_;
        local_10c._0_8_ = local_120._0_8_;
        local_10c.z = local_120.z;
        local_f0._0_8_ = local_100._0_8_;
        local_f0.z = local_100.z;
        local_d0._0_8_ = local_100._0_8_;
        local_d0.z = local_100.z;
        local_c0 = local_e0;
        local_b0 = local_100.z;
        local_a8 = local_e0;
        local_98 = local_e0;
        local_88 = local_e0;
        local_80._0_8_ = local_120._0_8_;
        local_80.z = local_120.z;
        local_70 = local_e0;
        local_60 = local_120.z;
        amrex::Array4<const_amrex::EBCellFlag>::Array4
                  ((Array4<const_amrex::EBCellFlag> *)local_1ac8,local_d8,&local_f0,&local_10c,
                   local_e4);
        local_1ac8._64_8_ = local_1ac8;
        amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  (in_stack_ffffffffffffd9b0,(MFIter *)in_stack_ffffffffffffd9a8,
                   (int)((ulong)in_stack_ffffffffffffd9a0 >> 0x20));
        amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffd9a8,
                   (MFIter *)in_stack_ffffffffffffd9a0);
        dUdt_in.m_arena = (Arena *)&stack0xffffffffffffe4a8;
        FVar4 = amrex::EBCellFlagFab::getType
                          (in_stack_ffffffffffffdac8,
                           (Box *)CONCAT44(in_stack_ffffffffffffdac4,in_stack_ffffffffffffdac0));
        if (FVar4 != covered) {
          local_290 = local_1a58;
          local_294 = 4;
          local_1b74._0_8_ = (local_1a58->super_BaseFab<amrex::EBCellFlag>)._vptr_BaseFab;
          local_1b74._8_8_ =
               (local_1a58->super_BaseFab<amrex::EBCellFlag>).super_DataAllocator.m_arena;
          local_1b64 = (local_1a58->super_BaseFab<amrex::EBCellFlag>).dptr;
          local_1b5c.itype = (local_1a58->super_BaseFab<amrex::EBCellFlag>).domain.smallend.vect[0];
          amrex::Box::grow((Box *)local_1b74,4);
          FVar4 = amrex::EBCellFlagFab::getType
                            (in_stack_ffffffffffffdac8,
                             (Box *)CONCAT44(in_stack_ffffffffffffdac4,in_stack_ffffffffffffdac0));
          if (FVar4 == regular) {
            in_stack_ffffffffffffdac4 = local_2c8;
            memcpy(local_20d8,&stack0xffffffffffffe4f0,0x3c);
            memcpy(&stack0xffffffffffffdf68,dUdt_in.m_arena,0x3c);
            amrex::
            ParallelFor<int,EBGodunov::ComputeAofs(amrex::MultiFab&,int,int,amrex::MultiFab_const&,int,amrex::MultiFab_const&,amrex::MultiFab_const&,amrex::MultiFab_const&,amrex::MultiFab&,amrex::MultiFab&,amrex::MultiFab&,int,bool,amrex::MultiFab&,amrex::MultiFab&,amrex::MultiFab&,int,amrex::MultiFab_const&,int,amrex::MultiFab_const&,amrex::Vector<amrex::BCRec,std::allocator<amrex::BCRec>>const&,amrex::BCRec_const*,amrex::Geometry_const&,amrex::Vector<int,std::allocator<int>>&,double,bool,std::__cxx11::string)::__8,void>
                      ((Box *)in_stack_ffffffffffffd9f0,
                       (int)((ulong)in_stack_ffffffffffffd9e8 >> 0x20),
                       (anon_class_128_2_3c46345a *)in_stack_ffffffffffffd9e0);
          }
          else {
            amrex::EBFArrayBoxFactory::getAreaFrac((EBFArrayBoxFactory *)in_stack_ffffffffffffd9a0);
            std::array<const_amrex::MultiCutFab_*,_3UL>::operator[]
                      ((array<const_amrex::MultiCutFab_*,_3UL> *)in_stack_ffffffffffffd9a0,
                       (size_type)pMVar16);
            amrex::MultiCutFab::const_array(in_stack_ffffffffffffd9a0,(MFIter *)pMVar16);
            amrex::EBFArrayBoxFactory::getAreaFrac((EBFArrayBoxFactory *)in_stack_ffffffffffffd9a0);
            std::array<const_amrex::MultiCutFab_*,_3UL>::operator[]
                      ((array<const_amrex::MultiCutFab_*,_3UL> *)in_stack_ffffffffffffd9a0,
                       (size_type)pMVar16);
            amrex::MultiCutFab::const_array(in_stack_ffffffffffffd9a0,(MFIter *)pMVar16);
            amrex::EBFArrayBoxFactory::getAreaFrac((EBFArrayBoxFactory *)in_stack_ffffffffffffd9a0);
            std::array<const_amrex::MultiCutFab_*,_3UL>::operator[]
                      ((array<const_amrex::MultiCutFab_*,_3UL> *)in_stack_ffffffffffffd9a0,
                       (size_type)pMVar16);
            amrex::MultiCutFab::const_array(in_stack_ffffffffffffd9a0,(MFIter *)pMVar16);
            amrex::EBFArrayBoxFactory::getFaceCent((EBFArrayBoxFactory *)in_stack_ffffffffffffd9a0);
            std::array<const_amrex::MultiCutFab_*,_3UL>::operator[]
                      ((array<const_amrex::MultiCutFab_*,_3UL> *)in_stack_ffffffffffffd9a0,
                       (size_type)pMVar16);
            amrex::MultiCutFab::const_array(in_stack_ffffffffffffd9a0,(MFIter *)pMVar16);
            amrex::EBFArrayBoxFactory::getFaceCent((EBFArrayBoxFactory *)in_stack_ffffffffffffd9a0);
            std::array<const_amrex::MultiCutFab_*,_3UL>::operator[]
                      ((array<const_amrex::MultiCutFab_*,_3UL> *)in_stack_ffffffffffffd9a0,
                       (size_type)pMVar16);
            amrex::MultiCutFab::const_array(in_stack_ffffffffffffd9a0,(MFIter *)pMVar16);
            amrex::EBFArrayBoxFactory::getFaceCent((EBFArrayBoxFactory *)in_stack_ffffffffffffd9a0);
            std::array<const_amrex::MultiCutFab_*,_3UL>::operator[]
                      ((array<const_amrex::MultiCutFab_*,_3UL> *)in_stack_ffffffffffffd9a0,
                       (size_type)pMVar16);
            amrex::MultiCutFab::const_array(in_stack_ffffffffffffd9a0,(MFIter *)pMVar16);
            amrex::EBFArrayBoxFactory::getCentroid((EBFArrayBoxFactory *)in_stack_ffffffffffffd9a0);
            amrex::MultiCutFab::const_array(in_stack_ffffffffffffd9a0,(MFIter *)pMVar16);
            amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                      ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffd9a8,
                       (MFIter *)in_stack_ffffffffffffd9a0);
            local_1e38 = (local_1a58->super_BaseFab<amrex::EBCellFlag>)._vptr_BaseFab;
            pAVar1 = (local_1a58->super_BaseFab<amrex::EBCellFlag>).super_DataAllocator.m_arena;
            uStack_1e24 = *(undefined8 *)
                           ((long)&(local_1a58->super_BaseFab<amrex::EBCellFlag>).dptr + 4);
            iStack_1e28 = (int)((ulong)*(undefined8 *)
                                        ((long)&(local_1a58->super_BaseFab<amrex::EBCellFlag>).
                                                super_DataAllocator.m_arena + 4) >> 0x20);
            iStack_1e30 = (int)pAVar1;
            local_1e2c = (int)((ulong)pAVar1 >> 0x20);
            local_1dd0 = local_1e10;
            bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)in_stack_ffffffffffffd9a0,(char *)pMVar16);
            if (bVar3) {
              amrex::Box::grow((Box *)&local_1e38,3);
            }
            else {
              bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)in_stack_ffffffffffffd9a0,(char *)pMVar16);
              if (bVar3) {
                amrex::Box::grow((Box *)&local_1e38,2);
              }
            }
            amrex::FArrayBox::FArrayBox
                      ((FArrayBox *)in_stack_ffffffffffffd9b0,(Box *)in_stack_ffffffffffffd9a8,
                       (int)((ulong)in_stack_ffffffffffffd9a0 >> 0x20),
                       SUB81((ulong)in_stack_ffffffffffffd9a0 >> 0x18,0),
                       SUB81((ulong)in_stack_ffffffffffffd9a0 >> 0x10,0),(Arena *)pMVar16);
            puVar15 = local_1e80;
            amrex::BaseFab<double>::elixir<double,_0>((BaseFab<double> *)in_stack_ffffffffffffd9c8);
            local_21c = 0;
            local_1c8 = *(double **)(puVar15 + 0x10);
            local_1d0 = (undefined8 *)(puVar15 + 0x18);
            local_1d4 = *(int *)(puVar15 + 0x34);
            local_17c = 0;
            local_1a8 = *(undefined4 *)local_1d0;
            local_18c = 1;
            uStack_1a4 = *(undefined4 *)(puVar15 + 0x1c);
            local_1f0._0_8_ = *local_1d0;
            local_19c = 2;
            local_1f0.z = *(int *)(puVar15 + 0x20);
            local_128 = (int *)(puVar15 + 0x24);
            local_12c = 0;
            local_158 = *local_128 + 1;
            local_138 = puVar15 + 0x24;
            local_13c = 1;
            iStack_154 = *(int *)(puVar15 + 0x28) + 1;
            local_148 = puVar15 + 0x24;
            local_14c = 2;
            local_210.z = *(int *)(puVar15 + 0x2c) + 1;
            local_210.y = iStack_154;
            local_210.x = local_158;
            this = &local_260;
            local_218 = puVar15;
            local_200._0_8_ = local_210._0_8_;
            local_200.z = local_210.z;
            local_1e0._0_8_ = local_1f0._0_8_;
            local_1e0.z = local_1f0.z;
            local_1c0._0_8_ = local_1f0._0_8_;
            local_1c0.z = local_1f0.z;
            local_1b0 = local_1d0;
            local_1a0 = local_1f0.z;
            local_198 = local_1d0;
            local_188 = local_1d0;
            local_178 = local_1d0;
            local_170._0_8_ = local_210._0_8_;
            local_170.z = local_210.z;
            local_160 = local_1d0;
            local_150 = local_210.z;
            amrex::Array4<double>::Array4(this,local_1c8,&local_1e0,&local_200,local_1d4);
            amrex::Array4<double>::Array4<double,_0>(&local_1ed8,this,local_21c);
            bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)in_stack_ffffffffffffd9a0,(char *)pMVar16);
            if (bVar3) {
              amrex::Box::Box<double>((Box *)in_stack_ffffffffffffd9a0,(Array4<double> *)pMVar16);
              memcpy(&stack0xffffffffffffe0c8,&local_1ed8,0x3c);
              amrex::
              ParallelFor<EBGodunov::ComputeAofs(amrex::MultiFab&,int,int,amrex::MultiFab_const&,int,amrex::MultiFab_const&,amrex::MultiFab_const&,amrex::MultiFab_const&,amrex::MultiFab&,amrex::MultiFab&,amrex::MultiFab&,int,bool,amrex::MultiFab&,amrex::MultiFab&,amrex::MultiFab&,int,amrex::MultiFab_const&,int,amrex::MultiFab_const&,amrex::Vector<amrex::BCRec,std::allocator<amrex::BCRec>>const&,amrex::BCRec_const*,amrex::Geometry_const&,amrex::Vector<int,std::allocator<int>>&,double,bool,std::__cxx11::string)::__6>
                        ((Box *)in_stack_ffffffffffffd9f0,
                         (anon_class_64_1_f62ae5da *)in_stack_ffffffffffffd9e8);
            }
            amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                      ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffd9a8,
                       (MFIter *)in_stack_ffffffffffffd9a0);
            amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                      (in_stack_ffffffffffffd9b0,(MFIter *)in_stack_ffffffffffffd9a8,
                       (int)((ulong)in_stack_ffffffffffffd9a0 >> 0x20));
            pMVar16 = (MultiCutFab *)local_1ac8._64_8_;
            in_stack_ffffffffffffd9e0 = in_stack_00000080;
            in_stack_ffffffffffffd9e8 = in_stack_00000088;
            std::__cxx11::string::string(local_1fd8,in_stack_000000a0);
            in_stack_ffffffffffffda00 = (FabArrayBase *)(local_2058 + 0x40);
            amrex::Array4<const_double>::Array4((Array4<const_double> *)in_stack_ffffffffffffda00);
            in_stack_ffffffffffffd9f0 = (MultiCutFab *)local_1fd8;
            in_stack_ffffffffffffd9c8 = &local_1d18;
            in_stack_ffffffffffffd9b0 =
                 (FabArray<amrex::FArrayBox> *)
                 ((long)&local_1d18.ownership.super__Bvector_base<std::allocator<bool>_>._M_impl.
                         super__Bvector_impl_data._M_finish + 8);
            in_stack_ffffffffffffd9a8 = (FabArray<amrex::EBCellFlagFab> *)&stack0xffffffffffffe3f0;
            in_stack_ffffffffffffd9a0 = (MultiCutFab *)&stack0xffffffffffffe448;
            Redistribution::Apply
                      (in_stack_ffffffffffffe500,in_stack_ffffffffffffe4fc,in_stack_ffffffffffffe4f0
                       ,(Array4<double> *)dUdt_in.m_arena,
                       (Array4<const_double> *)in_stack_ffffffffffffe4e0._M_head_impl,
                       in_stack_ffffffffffffe4d8,in_stack_ffffffffffffef30,in_stack_ffffffffffffef38
                       ,in_stack_ffffffffffffef40,in_stack_ffffffffffffef48,
                       in_stack_ffffffffffffef50,in_stack_ffffffffffffef58,in_stack_ffffffffffffef60
                       ,in_stack_ffffffffffffef68,in_stack_ffffffffffffef70,
                       in_stack_ffffffffffffef78,in_stack_ffffffffffffef80,
                       (Real)in_stack_ffffffffffffe4d0,in_stack_ffffffffffffef88,
                       in_stack_ffffffffffffef90,(Real)in_stack_ffffffffffffe4c8.data,
                       in_stack_ffffffffffffef98);
            std::__cxx11::string::~string(local_1fd8);
            in_stack_ffffffffffffdac8 = local_1a58;
            memcpy(local_2058,&stack0xffffffffffffe4f0,0x3c);
            amrex::
            ParallelFor<int,EBGodunov::ComputeAofs(amrex::MultiFab&,int,int,amrex::MultiFab_const&,int,amrex::MultiFab_const&,amrex::MultiFab_const&,amrex::MultiFab_const&,amrex::MultiFab&,amrex::MultiFab&,amrex::MultiFab&,int,bool,amrex::MultiFab&,amrex::MultiFab&,amrex::MultiFab&,int,amrex::MultiFab_const&,int,amrex::MultiFab_const&,amrex::Vector<amrex::BCRec,std::allocator<amrex::BCRec>>const&,amrex::BCRec_const*,amrex::Geometry_const&,amrex::Vector<int,std::allocator<int>>&,double,bool,std::__cxx11::string)::__7,void>
                      ((Box *)in_stack_ffffffffffffd9f0,
                       (int)((ulong)in_stack_ffffffffffffd9e8 >> 0x20),
                       (anon_class_64_1_e8a15f1b *)in_stack_ffffffffffffd9e0);
            amrex::Gpu::Elixir::~Elixir((Elixir *)in_stack_ffffffffffffd9a0);
            amrex::FArrayBox::~FArrayBox((FArrayBox *)0x7b7b85);
          }
        }
        amrex::MFIter::operator++(&local_1a50);
      }
      amrex::MFIter::~MFIter((MFIter *)in_stack_ffffffffffffd9a0);
      amrex::MultiFab::~MultiFab((MultiFab *)0x7b7c6e);
      amrex::MultiFab::~MultiFab((MultiFab *)0x7b7c7b);
      amrex::PODVector<int,_std::allocator<int>_>::~PODVector
                ((PODVector<int,_std::allocator<int>_> *)in_stack_ffffffffffffd9a0);
      return;
    }
    piVar8 = amrex::Vector<int,_std::allocator<int>_>::operator[]
                       ((Vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffd9a0,
                        (size_type)pMVar16);
    if (*piVar8 == 0) {
      ppMVar9 = std::array<const_amrex::MultiFab_*,_3UL>::operator[]
                          ((array<const_amrex::MultiFab_*,_3UL> *)in_stack_ffffffffffffd9a0,
                           (size_type)pMVar16);
      *ppMVar9 = (value_type)local_2e0;
      ppMVar9 = std::array<const_amrex::MultiFab_*,_3UL>::operator[]
                          ((array<const_amrex::MultiFab_*,_3UL> *)in_stack_ffffffffffffd9a0,
                           (size_type)pMVar16);
      *ppMVar9 = (value_type)in_stack_00000008;
      ppMVar9 = std::array<const_amrex::MultiFab_*,_3UL>::operator[]
                          ((array<const_amrex::MultiFab_*,_3UL> *)in_stack_ffffffffffffd9a0,
                           (size_type)pMVar16);
      *ppMVar9 = (value_type)in_stack_00000010;
      bVar3 = amrex::EBFArrayBoxFactory::isAllRegular((EBFArrayBoxFactory *)0x7b5757);
      if (bVar3) {
        amrex::computeDivergence
                  (in_stack_ffffffffffffdbf0,in_stack_ffffffffffffdbe8,in_stack_ffffffffffffdbe0);
        in_stack_ffffffffffffdea0 = local_2e0;
        in_stack_ffffffffffffdea8 = in_stack_00000008;
        in_stack_ffffffffffffdeb0 = in_stack_00000010;
      }
      else {
        amrex::EB_computeDivergence
                  (in_stack_ffffffffffffe2b8,in_stack_ffffffffffffe2b0,in_stack_ffffffffffffe2a8,
                   (bool)in_stack_ffffffffffffe2a7);
        in_stack_ffffffffffffdea0 = local_2e0;
        in_stack_ffffffffffffdea8 = in_stack_00000008;
        in_stack_ffffffffffffdeb0 = in_stack_00000010;
      }
      goto LAB_007b585d;
    }
    local_700 = (Box *)((long)(local_700->smallend).vect + 1);
  } while( true );
}

Assistant:

void
EBGodunov::ComputeAofs ( MultiFab& aofs, const int aofs_comp, const int ncomp,
                         MultiFab const& state, const int state_comp,
                         AMREX_D_DECL( MultiFab const& umac,
                                       MultiFab const& vmac,
                                       MultiFab const& wmac),
                         AMREX_D_DECL( MultiFab& xedge,
                                       MultiFab& yedge,
                                       MultiFab& zedge),
                         const int  edge_comp,
                         const bool known_edgestate,
                         AMREX_D_DECL( MultiFab& xfluxes,
                                       MultiFab& yfluxes,
                                       MultiFab& zfluxes),
                         int fluxes_comp,
                         MultiFab const& fq,
                         const int fq_comp,
                         MultiFab const& divu,
                         Vector<BCRec> const& h_bc,
                         BCRec const* d_bc,
                         Geometry const& geom,
                         Vector<int>& iconserv,
                         const Real dt,
                         const bool is_velocity,
                         std::string redistribution_type)
{
    BL_PROFILE("EBGodunov::ComputeAofs()");

    bool fluxes_are_area_weighted = true;

    // Make a device copy of the iconserv vector for use in kernels
    Gpu::DeviceVector<int> iconserv_d(iconserv.size());
    Gpu::copy(Gpu::hostToDevice, iconserv.begin(), iconserv.end(), iconserv_d.begin());
    int const* iconserv_ptr = iconserv_d.data();

    AMREX_ALWAYS_ASSERT(state.hasEBFabFactory());

    auto const& ebfact= dynamic_cast<EBFArrayBoxFactory const&>(state.Factory());
    auto const& flags = ebfact.getMultiEBCellFlagFab();
    auto const& fcent = ebfact.getFaceCent();
    auto const& ccent = ebfact.getCentroid();
    auto const& vfrac = ebfact.getVolFrac();
    auto const& areafrac = ebfact.getAreaFrac();

    // Create temporary holder for advection term. Needed so we can call FillBoundary.
    MultiFab advc(state.boxArray(),state.DistributionMap(),ncomp,3,MFInfo(),ebfact);
    advc.setVal(0.);

    // if we need convective form, we must also compute
    // div(u_mac)
    MultiFab divu_mac(state.boxArray(),state.DistributionMap(),1,0, MFInfo(), ebfact);
    for (Long i = 0; i < iconserv.size(); ++i)
    {
        if (!iconserv[i])
        {
            Array<MultiFab const*,AMREX_SPACEDIM> u;
            AMREX_D_TERM(u[0] = &umac;,
                         u[1] = &vmac;,
                         u[2] = &wmac;);

            if (!ebfact.isAllRegular())
                amrex::EB_computeDivergence(divu_mac,u,geom,true);
            else
                amrex::computeDivergence(divu_mac,u,geom);

            break;
        }
    }

    // Compute -div instead of computing div -- this is just for consistency
    // with the way we HAVE to do it for EB (because redistribution operates on
    // -div rather than div
    Real mult = -1.0;

#ifdef _OPENMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(aofs, TilingIfNotGPU()); mfi.isValid(); ++mfi)
    {

        const Box& bx   = mfi.tilebox();

        auto const& flagfab = ebfact.getMultiEBCellFlagFab()[mfi];
    // A regular box uses 3 ghost cells:
    // We predict the state on the edge based box; that calls slopes on
    // i & i-1; slopes then looks at (i-1)-2 for 4th order slopes
    // => test on bx grow 3
        bool regular = (flagfab.getType(amrex::grow(bx,3)) == FabType::regular);

        // Get handlers to Array4
        //
        AMREX_D_TERM( const auto& fx = xfluxes.array(mfi,fluxes_comp);,
                      const auto& fy = yfluxes.array(mfi,fluxes_comp);,
                      const auto& fz = zfluxes.array(mfi,fluxes_comp););

        AMREX_D_TERM( const auto& xed = xedge.array(mfi,edge_comp);,
                      const auto& yed = yedge.array(mfi,edge_comp);,
                      const auto& zed = zedge.array(mfi,edge_comp););

        AMREX_D_TERM( const auto& u = umac.const_array(mfi);,
                      const auto& v = vmac.const_array(mfi);,
                      const auto& w = wmac.const_array(mfi););

    Array4<Real> advc_arr = advc.array(mfi);

        if (flagfab.getType(bx) == FabType::covered)
        {
        AMREX_D_TERM( const Box& xbx = mfi.nodaltilebox(0);,
              const Box& ybx = mfi.nodaltilebox(1);,
              const Box& zbx = mfi.nodaltilebox(2); );

            auto const& aofs_arr = aofs.array(mfi, aofs_comp);

            amrex::ParallelFor(
                bx, ncomp, [aofs_arr] AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
                { aofs_arr( i, j, k, n ) = covered_val;},

                xbx, ncomp, [fx,xed] AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
                { fx( i, j, k, n ) = 0.0; xed( i, j, k, n ) = covered_val;},

                ybx, ncomp, [fy,yed] AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
                { fy( i, j, k, n ) = 0.0; yed( i, j, k, n ) = covered_val;});

#if (AMREX_SPACEDIM==3)
            amrex::ParallelFor(
                zbx, ncomp, [fz,zed]AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
                { fz( i, j, k, n ) = 0.0; zed( i, j, k, n ) = covered_val;});
#endif
        }
        else
        {
        if (regular)   // Plain Godunov
        {
            if (!known_edgestate)
            {
                Godunov::ComputeEdgeState( bx, ncomp,
                                           state.array(mfi,state_comp),
                                           AMREX_D_DECL( xed, yed, zed ),
                                           AMREX_D_DECL( u, v, w ),
                                           divu.array(mfi),
                                           fq.array(mfi,fq_comp),
                                           geom, dt, d_bc,
                                           iconserv_ptr,
                                           false,
                                           false,
                                           is_velocity );
            }

            HydroUtils::ComputeFluxes( bx,
                                       AMREX_D_DECL( fx, fy, fz ),
                                       AMREX_D_DECL( u, v, w ),
                                       AMREX_D_DECL( xed, yed, zed ),
                                       geom, ncomp, fluxes_are_area_weighted );

            HydroUtils::ComputeDivergence( bx, advc_arr,
                                           AMREX_D_DECL( fx, fy, fz ),
                                           ncomp, geom,
                                           mult, fluxes_are_area_weighted);

            // Compute the convective form if needed by accounting for extra term
            auto const& divu_arr  = divu_mac.array(mfi);
            amrex::ParallelFor(bx, ncomp, [=]
            AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
            {
                if (!iconserv_ptr[n])
                {
                    Real q = xed(i,j,k,n) + xed(i+1,j,k,n)
                           + yed(i,j,k,n) + yed(i,j+1,k,n);
#if (AMREX_SPACEDIM == 2)
                    q *= 0.25;
#else
                    q += zed(i,j,k,n) + zed(i,j,k+1,n);
                    q /= 6.0;
#endif
                    advc_arr(i,j,k,n) += q*divu_arr(i,j,k);
                }
            });

        }
        else     // EB Godunov
        {
            AMREX_D_TERM(Array4<Real const> const& fcx = fcent[0]->const_array(mfi);,
                         Array4<Real const> const& fcy = fcent[1]->const_array(mfi);,
                         Array4<Real const> const& fcz = fcent[2]->const_array(mfi););

            AMREX_D_TERM(Array4<Real const> const& apx = areafrac[0]->const_array(mfi);,
                         Array4<Real const> const& apy = areafrac[1]->const_array(mfi);,
                         Array4<Real const> const& apz = areafrac[2]->const_array(mfi););

            Array4<Real const> const& ccent_arr = ccent.const_array(mfi);
            Array4<Real const> const& vfrac_arr = vfrac.const_array(mfi);
            auto const& flags_arr  = flags.const_array(mfi);

        //FIXME - compare to HydroUtils which hard codes 4 ghost cells for all
            int ngrow = 4;

            if (redistribution_type=="StateRedist")
                ++ngrow;

            FArrayBox tmpfab(amrex::grow(bx,ngrow),  (4*AMREX_SPACEDIM + 2)*ncomp);
            Elixir    eli = tmpfab.elixir();


            if (!known_edgestate)
            {
                EBGodunov::ComputeEdgeState( bx, ncomp,
                                             state.array(mfi,state_comp),
                                             AMREX_D_DECL( xed, yed, zed ),
                                             AMREX_D_DECL( u, v, w ),
                                             divu.array(mfi),
                                             fq.array(mfi,fq_comp),
                                             geom, dt, h_bc, d_bc,
                                             iconserv_ptr,
                                             tmpfab.dataPtr(),
                                             flags_arr,
                                             AMREX_D_DECL( apx, apy, apz ),
                                             vfrac_arr,
                                             AMREX_D_DECL( fcx, fcy, fcz ),
                                             ccent_arr,
                                             is_velocity,
                                             Array4<Real const>{} );
            }

            HydroUtils::EB_ComputeFluxes( bx,
                                          AMREX_D_DECL( fx, fy, fz ),
                                          AMREX_D_DECL( u, v, w ),
                                          AMREX_D_DECL( xed, yed, zed ),
                                          AMREX_D_DECL( apx, apy, apz ),
                                          geom, ncomp, flags_arr, fluxes_are_area_weighted );

            // div at ncomp*3 to make space for the 3 redistribute temporaries
            HydroUtils::EB_ComputeDivergence( bx,
                                              advc_arr,
                                              AMREX_D_DECL( fx, fy, fz ),
                                              vfrac_arr, ncomp, geom,
                                              mult, fluxes_are_area_weighted);

            // Compute the convective form if needed by accounting for extra term
            auto const& divu_arr  = divu_mac.array(mfi);
            amrex::ParallelFor(bx, ncomp, [=]
            AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
            {
                if (!iconserv_ptr[n])
                {
          if ( vfrac_arr(i,j,k) != 0 )
                  {
                    Real q = xed(i,j,k,n)*apx(i,j,k) + xed(i+1,j,k,n)*apx(i+1,j,k)
                           + yed(i,j,k,n)*apy(i,j,k) + yed(i,j+1,k,n)*apy(i,j+1,k);
#if (AMREX_SPACEDIM == 2)
                    q /= (apx(i,j,k)+apx(i+1,j,k)+apy(i,j,k)+apy(i,j+1,k));
#else
                    q += zed(i,j,k,n)*apz(i,j,k) + zed(i,j,k+1,n)*apz(i,j,k+1);
                    q /= (apx(i,j,k)+apx(i+1,j,k)+apy(i,j,k)+apy(i,j+1,k)+apz(i,j,k)+apz(i,j,k+1));
#endif
                    advc_arr(i,j,k,n) += q*divu_arr(i,j,k);
          }
                 }
            });
      }
    }
    }

    advc.FillBoundary(geom.periodicity());

#ifdef _OPENMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(aofs, TilingIfNotGPU()); mfi.isValid(); ++mfi)
    {
        auto const& bx = mfi.tilebox();

        auto const& flagfab = ebfact.getMultiEBCellFlagFab()[mfi];
        auto const& flag    = flagfab.const_array();
    auto const& aofs_arr = aofs.array(mfi, aofs_comp);
    auto const& advc_arr = advc.array(mfi);

        if (flagfab.getType(bx) != FabType::covered )
    {
      // FIXME? not sure if 4 is really needed or if 3 could do
      // But this is a safe choice
      if (flagfab.getType(grow(bx,4)) != FabType::regular)
      {
        //
        // Redistribute
        //
        AMREX_D_TERM( auto apx = ebfact.getAreaFrac()[0]->const_array(mfi);,
              auto apy = ebfact.getAreaFrac()[1]->const_array(mfi);,
              auto apz = ebfact.getAreaFrac()[2]->const_array(mfi); );

        AMREX_D_TERM( Array4<Real const> fcx = ebfact.getFaceCent()[0]->const_array(mfi);,
              Array4<Real const> fcy = ebfact.getFaceCent()[1]->const_array(mfi);,
              Array4<Real const> fcz = ebfact.getFaceCent()[2]->const_array(mfi););

        Array4<Real const> ccc = ebfact.getCentroid().const_array(mfi);
            Array4<Real const> const& vfrac_arr = vfrac.const_array(mfi);

        // This is scratch space if calling StateRedistribute,
            //  but is used as the weights (here set to 1) if calling
            //  FluxRedistribute
        Box gbx = bx;

        if (redistribution_type == "StateRedist")
          gbx.grow(3);
        else if (redistribution_type == "FluxRedist")
          gbx.grow(2);

        FArrayBox tmpfab(gbx, ncomp);
        Elixir eli = tmpfab.elixir();
            Array4<Real> scratch = tmpfab.array(0);
            if (redistribution_type == "FluxRedist")
            {
                amrex::ParallelFor(Box(scratch),
                [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
                { scratch(i,j,k) = 1.;});
            }

        Redistribution::Apply( bx, ncomp, aofs_arr, advc.array(mfi),
                   state.const_array(mfi, state_comp), scratch, flag,
                                   AMREX_D_DECL(apx,apy,apz), vfrac_arr,
                   AMREX_D_DECL(fcx,fcy,fcz), ccc, d_bc,
                                   geom, dt, redistribution_type );

        // Change sign because we computed -div for all cases
        amrex::ParallelFor(bx, ncomp, [aofs_arr]
        AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
        { aofs_arr( i, j, k, n ) *=  - 1.0; });
      }
      else
      {
        // Change sign because for EB we computed -div
            amrex::ParallelFor(bx, ncomp, [aofs_arr, advc_arr]
        AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
        { aofs_arr( i, j, k, n ) =  -advc_arr(i,j,k,n); });
      }
    }
    }
}